

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::removeFederateHandles(HandleManager *this,GlobalFederateId fedToRemove)

{
  _Elt_pointer pBVar1;
  _Elt_pointer pBVar2;
  _Map_pointer ppBVar3;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *__range1;
  BasicHandleInfo *handle;
  _Elt_pointer pBVar4;
  
  pBVar4 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  ppBVar3 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pBVar1 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pBVar4 != pBVar1) {
    if ((pBVar4->handle).fed_id.gid == fedToRemove.gid) {
      removeHandle(this,pBVar4->handle);
    }
    pBVar4 = pBVar4 + 1;
    if (pBVar4 == pBVar2) {
      pBVar4 = ppBVar3[1];
      ppBVar3 = ppBVar3 + 1;
      pBVar2 = pBVar4 + 3;
    }
  }
  return;
}

Assistant:

void HandleManager::removeFederateHandles(GlobalFederateId fedToRemove)
{
    for (auto& handle : handles) {
        if (handle.getFederateId() == fedToRemove) {
            removeHandle(handle.handle);
        }
    }
}